

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> **args,uint *args_1,uint *args_2)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Entry *__cur_1;
  pointer pEVar8;
  pointer pEVar9;
  pointer pEVar10;
  pointer pEVar11;
  long lVar12;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar13;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar13 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar13 < ctx) {
    pEVar13 = ctx;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    pEVar13 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pEVar8 = (pointer)operator_new((long)pEVar13 << 4);
  uVar1 = *args_1;
  uVar2 = *args_2;
  *(LeafNode<unsigned_long,_std::monostate,_11U,_true> **)((long)pEVar8 + lVar12) = *args;
  *(uint *)((long)pEVar8 + lVar12 + 8) = uVar1;
  *(uint *)((long)pEVar8 + lVar12 + 0xc) = uVar2;
  pEVar11 = this->data_;
  pEVar9 = pEVar11 + this->len;
  pEVar10 = pEVar8;
  if (pEVar9 == pos) {
    for (; pEVar11 != pos; pEVar11 = pEVar11 + 1) {
      uVar6 = pEVar11->size;
      uVar7 = pEVar11->offset;
      pEVar10->node = pEVar11->node;
      pEVar10->size = uVar6;
      pEVar10->offset = uVar7;
      pEVar10 = pEVar10 + 1;
    }
  }
  else {
    for (; pEVar11 != pos; pEVar11 = pEVar11 + 1) {
      uVar6 = pEVar11->size;
      uVar7 = pEVar11->offset;
      pEVar10->node = pEVar11->node;
      pEVar10->size = uVar6;
      pEVar10->offset = uVar7;
      pEVar10 = pEVar10 + 1;
    }
    puVar4 = (undefined8 *)((long)pEVar8 + lVar12);
    for (; pos != pEVar9; pos = pos + 1) {
      uVar5 = *(undefined8 *)&pos->size;
      puVar4[2] = pos->node;
      puVar4[3] = uVar5;
      puVar4 = puVar4 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar13;
  this->data_ = pEVar8;
  return (pointer)((long)pEVar8 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}